

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

void __thiscall
kwssys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  memset(this,0,0x208);
  if (rxp->program == (char *)0x0) {
    this->program = (char *)0x0;
  }
  else {
    iVar1 = rxp->progsize;
    this->progsize = iVar1;
    iVar2 = -1;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    pcVar3 = (char *)operator_new__((long)iVar2);
    this->program = pcVar3;
    lVar4 = (long)iVar1;
    while (lVar4 != 0) {
      this->program[lVar4 + -1] = rxp->program[lVar4 + -1];
      lVar4 = lVar4 + -1;
    }
    memcpy(this,rxp,0x208);
    pcVar3 = rxp->regmust;
    this->regmust = pcVar3;
    if (pcVar3 != (char *)0x0) {
      this->regmust = this->program + (uint)((int)pcVar3 - *(int *)&rxp->program);
    }
    this->regstart = rxp->regstart;
    this->reganch = rxp->reganch;
    this->regmlen = rxp->regmlen;
  }
  return;
}

Assistant:

RegularExpression::RegularExpression(const RegularExpression& rxp)
{
  if (!rxp.program) {
    this->program = nullptr;
    return;
  }
  int ind;
  this->progsize = rxp.progsize;            // Copy regular expression size
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust != nullptr) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data
}